

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::LinkedModelFile::ByteSizeLong(LinkedModelFile *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  
  if (this->linkedmodelfilename_ == (StringParameter *)0x0 ||
      this == (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = StringParameter::ByteSizeLong(this->linkedmodelfilename_);
    uVar4 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->linkedmodelsearchpath_ != (StringParameter *)0x0 &&
      this != (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    sVar3 = StringParameter::ByteSizeLong(this->linkedmodelsearchpath_);
    uVar4 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + sVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t LinkedModelFile::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LinkedModelFile)
  size_t total_size = 0;

  // .CoreML.Specification.StringParameter linkedModelFileName = 1;
  if (this->has_linkedmodelfilename()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->linkedmodelfilename_);
  }

  // .CoreML.Specification.StringParameter linkedModelSearchPath = 2;
  if (this->has_linkedmodelsearchpath()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->linkedmodelsearchpath_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}